

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke_test.cc
# Opt level: O0

void __thiscall
bssl::HPKETest_SetupRecipientWrongLengthEnc_Test::TestBody
          (HPKETest_SetupRecipientWrongLengthEnc_Test *this)

{
  bool bVar1;
  int iVar2;
  evp_hpke_key_st *peVar3;
  EVP_HPKE_KEM *kem;
  char *pcVar4;
  evp_hpke_ctx_st *ctx;
  EVP_HPKE_KDF *kdf;
  EVP_HPKE_AEAD *aead;
  char *message;
  ulong uVar5;
  char *in_R9;
  string local_458;
  AssertHelper local_438;
  Message local_430;
  undefined1 local_428 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_3f8;
  Message local_3f0;
  bool local_3e1;
  undefined1 local_3e0 [8];
  AssertionResult gtest_ar__1;
  ScopedEVP_HPKE_CTX recipient_ctx;
  uint8_t bogus_enc [37];
  string local_d8;
  AssertHelper local_b8;
  Message local_b0 [3];
  int local_94;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_;
  ScopedEVP_HPKE_KEY key;
  HPKETest_SetupRecipientWrongLengthEnc_Test *this_local;
  
  internal::
  StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
  ::StackAllocatedMovable
            ((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
              *)&gtest_ar_.message_);
  peVar3 = internal::
           StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
           ::get((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                  *)&gtest_ar_.message_);
  kem = EVP_hpke_x25519_hkdf_sha256();
  local_94 = EVP_HPKE_KEY_generate(peVar3,kem);
  testing::AssertionResult::AssertionResult<int>((AssertionResult *)local_90,&local_94,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d8,(internal *)local_90,
               (AssertionResult *)"EVP_HPKE_KEY_generate(key.get(), EVP_hpke_x25519_hkdf_sha256())",
               "false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
               ,0x262,pcVar4);
    testing::internal::AssertHelper::operator=(&local_b8,local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    testing::Message::~Message(local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  if (bVar1) {
    recipient_ctx.ctx_.is_sender = 0xff;
    recipient_ctx.ctx_._708_4_ = 0;
    internal::StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>::
    StackAllocated((StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>
                    *)&gtest_ar__1.message_);
    ctx = internal::StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>
          ::get((StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup> *)
                &gtest_ar__1.message_);
    peVar3 = internal::
             StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
             ::get((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                    *)&gtest_ar_.message_);
    kdf = EVP_hpke_hkdf_sha256();
    aead = EVP_hpke_aes_128_gcm();
    pcVar4 = (char *)0x25;
    iVar2 = EVP_HPKE_CTX_setup_recipient
                      (ctx,peVar3,kdf,aead,(uint8_t *)&recipient_ctx.ctx_.is_sender,0x25,
                       (uint8_t *)0x0,0);
    local_3e1 = iVar2 == 0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_3e0,&local_3e1,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e0);
    if (!bVar1) {
      testing::Message::Message(&local_3f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_3e0,
                 (AssertionResult *)
                 "EVP_HPKE_CTX_setup_recipient( recipient_ctx.get(), key.get(), EVP_hpke_hkdf_sha256(), EVP_hpke_aes_128_gcm(), bogus_enc, sizeof(bogus_enc), nullptr, 0)"
                 ,"true","false",pcVar4);
      message = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_3f8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
                 ,0x269,message);
      testing::internal::AssertHelper::operator=(&local_3f8,&local_3f0);
      testing::internal::AssertHelper::~AssertHelper(&local_3f8);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_3f0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e0);
    if (bVar1) {
      uVar5 = ERR_get_error();
      ErrorEquals((uint32_t)local_428,(int)uVar5,6);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_428);
      if (!bVar1) {
        testing::Message::Message(&local_430);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_458,(internal *)local_428,
                   (AssertionResult *)"ErrorEquals(ERR_get_error(), ERR_LIB_EVP, 134)","false",
                   "true",pcVar4);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_438,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
                   ,0x26b,pcVar4);
        testing::internal::AssertHelper::operator=(&local_438,&local_430);
        testing::internal::AssertHelper::~AssertHelper(&local_438);
        std::__cxx11::string::~string((string *)&local_458);
        testing::Message::~Message(&local_430);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_428);
      ERR_clear_error();
    }
    internal::StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>::
    ~StackAllocated((StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>
                     *)&gtest_ar__1.message_);
  }
  internal::
  StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
  ::~StackAllocatedMovable
            ((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
              *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(HPKETest, SetupRecipientWrongLengthEnc) {
  ScopedEVP_HPKE_KEY key;
  ASSERT_TRUE(EVP_HPKE_KEY_generate(key.get(), EVP_hpke_x25519_hkdf_sha256()));

  const uint8_t bogus_enc[X25519_PUBLIC_VALUE_LEN + 5] = {0xff};

  ScopedEVP_HPKE_CTX recipient_ctx;
  ASSERT_FALSE(EVP_HPKE_CTX_setup_recipient(
      recipient_ctx.get(), key.get(), EVP_hpke_hkdf_sha256(),
      EVP_hpke_aes_128_gcm(), bogus_enc, sizeof(bogus_enc), nullptr, 0));
  EXPECT_TRUE(
      ErrorEquals(ERR_get_error(), ERR_LIB_EVP, EVP_R_INVALID_PEER_KEY));
  ERR_clear_error();
}